

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midithread.c
# Opt level: O2

void process_midi(PtTimestamp timestamp,void *userData)

{
  PmError PVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int32_t msg;
  int local_3c;
  PmEvent buffer;
  
  if (active != 0) {
    iVar2 = transpose;
    do {
      while( true ) {
        while( true ) {
          do {
            transpose = iVar2;
            PVar1 = Pm_Dequeue(main_to_midi,&msg);
            if (PVar1 == pmNoData) {
              while (PVar1 = Pm_Poll(midi_in), PVar1 != pmNoData) {
                iVar2 = Pm_Read(midi_in,&buffer,1);
                if (iVar2 != -0x270c) {
                  if (midi_thru != 0) {
                    Pm_Write(midi_out,&buffer,1);
                  }
                  if ((buffer.message & 0xe0U | 0x10) == 0x90) {
                    iVar4 = ((uint)buffer.message >> 8 & 0xff) + transpose;
                    iVar2 = 0x7f;
                    if (iVar4 < 0x7f) {
                      iVar2 = iVar4;
                    }
                    uVar3 = (iVar4 - iVar2) + 0xb;
                    local_3c = iVar4 + (uVar3 / 0xc) * -0xc + -0xc;
                    uVar3 = ((uVar3 % 0xc - uVar3) + iVar4) * 0x100 - 0xc00;
                    do {
                      uVar3 = uVar3 + 0xc00;
                      local_3c = local_3c + 0xc;
                    } while (local_3c < 0);
                    buffer.message = buffer.message & 0xff00ffU | uVar3 & 0xff00;
                    Pm_Write(midi_out,&buffer,1);
                    if (monitor != 0) {
                      Pm_Enqueue(midi_to_main,&local_3c);
                      monitor = 0;
                    }
                  }
                }
              }
              return;
            }
            iVar2 = msg;
          } while (msg + 0x7fU < 0xff);
          iVar2 = transpose;
          if (msg != 0x3e9) break;
          monitor = 1;
        }
        if (msg != 0x3ea) break;
        midi_thru = (int)(midi_thru == 0);
      }
    } while (msg != 1000);
    Pm_Enqueue(midi_to_main,&msg);
    active = 0;
  }
  return;
}

Assistant:

void process_midi(PtTimestamp timestamp, void *userData)
{
    PmError result;
    PmEvent buffer; /* just one message at a time */
    int32_t msg;

    /* do nothing until initialization completes */
    if (!active) 
        return;

    /* check for messages */
    do { 
        result = Pm_Dequeue(main_to_midi, &msg); 
        if (result) {
            if (msg >= -127 && msg <= 127) 
                transpose = msg;
            else if (msg == QUIT_MSG) {
                /* acknowledge receipt of quit message */
                Pm_Enqueue(midi_to_main, &msg);
                active = FALSE;
                return;
            } else if (msg == MONITOR_MSG) {
                /* main has requested a pitch. monitor is a flag that
                 * records the request:
                 */
                monitor = TRUE;
            } else if (msg == THRU_MSG) {
                /* toggle Thru on or off */
                midi_thru = !midi_thru;
            }
        }
    } while (result);         
    
    /* see if there is any midi input to process */
    do {
		result = Pm_Poll(midi_in);
        if (result) {
            int status, data1, data2;
            if (Pm_Read(midi_in, &buffer, 1) == pmBufferOverflow) 
                continue;
            if (midi_thru) 
                Pm_Write(midi_out, &buffer, 1);
            /* unless there was overflow, we should have a message now */
            status = Pm_MessageStatus(buffer.message);
            data1 = Pm_MessageData1(buffer.message);
            data2 = Pm_MessageData2(buffer.message);
            if ((status & 0xF0) == 0x90 ||
                (status & 0xF0) == 0x80) {
                
                /* this is a note-on or note-off, so transpose and send */
                data1 += transpose;
                
                /* keep within midi pitch range, keep proper pitch class */
                while (data1 > 127) 
                    data1 -= 12;
                while (data1 < 0) 
                    data1 += 12;
                
                /* send the message */
                buffer.message = Pm_Message(status, data1, data2);
                Pm_Write(midi_out, &buffer, 1);
                
                /* if monitor is set, send the pitch to the main thread */
                if (monitor) {
                    Pm_Enqueue(midi_to_main, &data1);
                    monitor = FALSE; /* only send one pitch per request */
                }
            }
        }
    } while (result);
}